

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O0

void report(long total_micros,int count)

{
  ostream *poVar1;
  double micros_per;
  double num_per_second;
  double total_seconds;
  int count_local;
  long total_micros_local;
  
  poVar1 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"    num: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,count);
  poVar1 = std::operator<<(poVar1,", total_seconds: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(double)total_micros / 1000000.0);
  poVar1 = std::operator<<(poVar1,", num_per_second: ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(double)count / ((double)total_micros / 1000000.0));
  poVar1 = std::operator<<(poVar1,", micros_per: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(double)total_micros / (double)count);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void report(long total_micros, int count) {
  double total_seconds = static_cast<double>(total_micros) / 1e6;
  double num_per_second = count / total_seconds;
  double micros_per = static_cast<double>(total_micros) / count;
  std::cout << std::endl
            << "    num: " << count << ", total_seconds: " << total_seconds << ", num_per_second: " << num_per_second
            << ", micros_per: " << micros_per << std::endl;
}